

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_new_connection_id_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  long lVar1;
  int iVar2;
  uint64_t *buf;
  uint64_t *buf_00;
  undefined8 uStackY_110;
  char acStackY_108 [32];
  uint64_t auStackY_e8 [3];
  quicly_conn_t *local_d0;
  int64_t local_c8 [2];
  quicly_new_connection_id_frame_t *in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  uint8_t **in_stack_ffffffffffffff58;
  ulong uVar3;
  size_t i;
  size_t num_unregistered_seqs;
  uint64_t unregistered_seqs [4];
  size_t _l_1;
  size_t _l;
  quicly_conn_t *_conn;
  quicly_new_connection_id_frame_t frame;
  int ret;
  st_quicly_handle_payload_state_t *state_local;
  quicly_conn_t *conn_local;
  
  auStackY_e8[1] = 0x14e3b8;
  conn_local._4_4_ =
       quicly_decode_new_connection_id_frame
                 (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (conn_local._4_4_ == 0) {
    buf = auStackY_e8 + 2;
    if (quicly_trace_fp != (FILE *)0x0) {
      auStackY_e8[1] = 0x14e408;
      iVar2 = ptls_skip_tracing((conn->crypto).tls);
      buf = auStackY_e8 + 2;
      if (iVar2 == 0) {
        local_c8[0] = (conn->stash).now;
        lVar1 = -((long)frame.cid.base * 2 + 0x10U & 0xfffffffffffffff0);
        buf_00 = (uint64_t *)((long)auStackY_e8 + lVar1 + 0x10);
        local_d0 = conn;
        *(undefined8 *)((long)auStackY_e8 + lVar1 + 8) = 0x14e46f;
        ptls_hexdump((char *)buf_00,(void *)frame.retire_prior_to,(size_t)frame.cid.base);
        buf = (uint64_t *)(acStackY_108 + lVar1);
        *(undefined8 *)((long)&uStackY_110 + lVar1) = 0x14e4a9;
        unregistered_seqs[3] = (uint64_t)ptls_hexdump((char *)buf,(void *)frame.cid.len,0x10);
        *(undefined8 *)((long)&uStackY_110 + lVar1) = 0x14e4d9;
        QUICLY_NEW_CONNECTION_ID_RECEIVE
                  (*(st_quicly_conn_t **)((long)local_c8 + lVar1 + 8),
                   *(int64_t *)((long)local_c8 + lVar1),*(uint64_t *)((long)&local_d0 + lVar1),
                   *buf_00,*(char **)((long)auStackY_e8 + lVar1 + 8),
                   *(char **)((long)auStackY_e8 + lVar1));
      }
    }
    if (_conn < (quicly_conn_t *)(conn->super).remote.largest_retire_prior_to) {
      buf[-1] = 0x14e4f9;
      schedule_retire_connection_id_frame((quicly_conn_t *)buf[1],*buf);
      conn_local._4_4_ = 0;
    }
    else {
      buf[-2] = (uint64_t)&num_unregistered_seqs;
      buf[-1] = (uint64_t)&i;
      buf[-3] = 0x14e544;
      conn_local._4_4_ =
           quicly_remote_cid_register
                     ((quicly_remote_cid_set_t *)buf[10],buf[9],(uint8_t *)buf[8],buf[7],
                      (uint8_t *)buf[6],buf[5],(uint64_t *)buf[0xd],(size_t *)buf[0xe]);
      if (conn_local._4_4_ == 0) {
        for (uVar3 = 0; uVar3 < i; uVar3 = uVar3 + 1) {
          buf[-1] = 0x14e58b;
          schedule_retire_connection_id_frame((quicly_conn_t *)buf[1],*buf);
        }
        if ((conn->super).remote.largest_retire_prior_to < frame.sequence) {
          (conn->super).remote.largest_retire_prior_to = frame.sequence;
        }
        conn_local._4_4_ = 0;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int handle_new_connection_id_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret;
    quicly_new_connection_id_frame_t frame;

    /* TODO: return error when using zero-length CID */

    if ((ret = quicly_decode_new_connection_id_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(NEW_CONNECTION_ID_RECEIVE, conn, conn->stash.now, frame.sequence, frame.retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(frame.cid.base, frame.cid.len),
                 QUICLY_PROBE_HEXDUMP(frame.stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    if (frame.sequence < conn->super.remote.largest_retire_prior_to) {
        /* An endpoint that receives a NEW_CONNECTION_ID frame with a sequence number smaller than the Retire Prior To
         * field of a previously received NEW_CONNECTION_ID frame MUST send a corresponding RETIRE_CONNECTION_ID frame
         * that retires the newly received connection ID, unless it has already done so for that sequence number. (19.15)
         * TODO: "unless ..." part may not be properly addressed here (we may already have sent the RCID frame for this
         * sequence) */
        schedule_retire_connection_id_frame(conn, frame.sequence);
        /* do not install this CID */
        return 0;
    }

    uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT];
    size_t num_unregistered_seqs;
    if ((ret = quicly_remote_cid_register(&conn->super.remote.cid_set, frame.sequence, frame.cid.base, frame.cid.len,
                                          frame.stateless_reset_token, frame.retire_prior_to, unregistered_seqs,
                                          &num_unregistered_seqs)) != 0)
        return ret;

    for (size_t i = 0; i < num_unregistered_seqs; i++)
        schedule_retire_connection_id_frame(conn, unregistered_seqs[i]);

    if (frame.retire_prior_to > conn->super.remote.largest_retire_prior_to)
        conn->super.remote.largest_retire_prior_to = frame.retire_prior_to;

    return 0;
}